

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  OfType OVar4;
  string *name;
  AssertionResult *this_00;
  AssertionResult *this_01;
  size_t sVar5;
  ScopedElement *this_02;
  long in_RSI;
  long in_RDI;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  ReusableStringStream rss;
  ScopedElement e;
  string elementName;
  AssertionResult *result;
  AssertionResult *in_stack_fffffffffffffd68;
  AssertionResult *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  Column *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  XmlFormatting fmt;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  AssertionResult *in_stack_fffffffffffffd98;
  ReusableStringStream *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdc0;
  XmlWriter *this_03;
  XmlWriter *this_04;
  undefined4 in_stack_fffffffffffffde0;
  string local_210 [32];
  SourceLineInfo local_1f0;
  undefined1 local_1d9;
  reference local_1d8;
  MessageInfo *local_1d0;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_1c8;
  long local_1c0;
  undefined1 local_1b1;
  string local_1b0 [32];
  string local_190 [38];
  undefined1 local_16a;
  undefined1 local_169;
  string local_168 [32];
  Column local_148;
  undefined1 local_111;
  string local_110 [56];
  StringRef local_d8;
  undefined1 local_c1 [72];
  undefined1 local_79 [97];
  AssertionResult *local_18;
  long local_10;
  
  fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_18 = (AssertionResult *)(in_RSI + 8);
  local_10 = in_RSI;
  bVar1 = AssertionResult::isOk(in_stack_fffffffffffffd70);
  if (bVar1) {
    return;
  }
  std::__cxx11::string::string((string *)(local_79 + 0x41));
  OVar4 = AssertionResult::getResultType(local_18);
  if ((3 < (uint)(OVar4 + Info)) && (OVar4 != FailureBit)) {
    if ((uint)(OVar4 + ~FailureBit) < 2) {
LAB_00142e31:
      std::__cxx11::string::operator=((string *)(local_79 + 0x41),"failure");
      goto LAB_00142e61;
    }
    if (OVar4 != Exception) {
      if (OVar4 != ThrewException) {
        if (OVar4 == DidntThrowException) goto LAB_00142e31;
        if (OVar4 != FatalErrorCondition) goto LAB_00142e61;
      }
      std::__cxx11::string::operator=((string *)(local_79 + 0x41),"error");
      goto LAB_00142e61;
    }
  }
  std::__cxx11::string::operator=((string *)(local_79 + 0x41),"internalError");
LAB_00142e61:
  name = (string *)(in_RDI + 0xd8);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            ((XmlWriter *)in_stack_fffffffffffffd98,
             (string *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),fmt);
  this_00 = (AssertionResult *)(in_RDI + 0xd8);
  this_04 = (XmlWriter *)local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdb0,
             (char *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
             (allocator<char> *)in_stack_fffffffffffffda0);
  AssertionResult::getExpression_abi_cxx11_(in_stack_fffffffffffffd98);
  XmlWriter::writeAttribute(this_04,(string *)this_00,in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string((string *)(local_c1 + 0x21));
  std::__cxx11::string::~string((string *)(local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_79);
  this_01 = (AssertionResult *)(in_RDI + 0xd8);
  this_03 = (XmlWriter *)local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdb0,
             (char *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
             (allocator<char> *)in_stack_fffffffffffffda0);
  local_d8 = AssertionResult::getTestMacroName(local_18);
  XmlWriter::writeAttribute<Catch::StringRef>
            ((XmlWriter *)CONCAT44(OVar4,in_stack_fffffffffffffde0),name,(StringRef *)this_04);
  std::__cxx11::string::~string((string *)(local_c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c1);
  ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffda0);
  sVar5 = Counts::total((Counts *)(local_10 + 0xb8));
  if (sVar5 == 0) {
    local_16a = 10;
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
  }
  else {
    in_stack_fffffffffffffdb0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ReusableStringStream::operator<<
                   ((ReusableStringStream *)in_stack_fffffffffffffd70,
                    (char (*) [7])in_stack_fffffffffffffd68);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffd70,
               (char (*) [3])in_stack_fffffffffffffd68);
    bVar1 = AssertionResult::hasExpression((AssertionResult *)0x14303a);
    if (bVar1) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,
                 (char (*) [3])in_stack_fffffffffffffd68);
      AssertionResult::getExpressionInMacro_abi_cxx11_(this_01);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd68);
      std::__cxx11::string::~string(local_110);
      local_111 = 10;
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                );
    }
    uVar2 = AssertionResult::hasExpandedExpression(this_00);
    if ((bool)uVar2) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,
                 (char (*) [17])in_stack_fffffffffffffd68);
      AssertionResult::getExpandedExpression_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffffda8));
      clara::TextFlow::Column::Column(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      clara::TextFlow::Column::indent(&local_148,2);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,
                 (Column *)in_stack_fffffffffffffd68);
      local_169 = 10;
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                );
      clara::TextFlow::Column::~Column((Column *)0x143284);
      std::__cxx11::string::~string(local_168);
    }
  }
  AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffd68);
  bVar3 = std::__cxx11::string::empty();
  bVar3 = bVar3 ^ 0xff;
  std::__cxx11::string::~string(local_190);
  if ((bVar3 & 1) != 0) {
    AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffd68);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffd70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd68);
    local_1b1 = 10;
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
    std::__cxx11::string::~string(local_1b0);
  }
  local_1c0 = local_10 + 0x98;
  local_1c8._M_current =
       (MessageInfo *)
       clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                 ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                  in_stack_fffffffffffffd68);
  local_1d0 = (MessageInfo *)
              clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                        ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                         in_stack_fffffffffffffd68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                             *)in_stack_fffffffffffffd70,
                            (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                             *)in_stack_fffffffffffffd68), bVar1) {
    local_1d8 = __gnu_cxx::
                __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                ::operator*(&local_1c8);
    if (local_1d8->type == Info) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd68);
      local_1d9 = 10;
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                );
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&local_1c8);
  }
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_fffffffffffffd70,
             (char (*) [4])in_stack_fffffffffffffd68);
  local_1f0 = AssertionResult::getSourceInfo(local_18);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_fffffffffffffd70,
             (SourceLineInfo *)in_stack_fffffffffffffd68);
  this_02 = (ScopedElement *)(in_RDI + 0xd8);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffd68);
  XmlWriter::writeText
            (this_03,(string *)this_01,(XmlFormatting)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
  std::__cxx11::string::~string(local_210);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffdb0);
  XmlWriter::ScopedElement::~ScopedElement(this_02);
  std::__cxx11::string::~string((string *)(local_79 + 0x41));
  return;
}

Assistant:

void JunitReporter::writeAssertion( AssertionStats const& stats ) {
        AssertionResult const& result = stats.assertionResult;
        if( !result.isOk() ) {
            std::string elementName;
            switch( result.getResultType() ) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;

                // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
            }

            XmlWriter::ScopedElement e = xml.scopedElement( elementName );

            xml.writeAttribute( "message", result.getExpression() );
            xml.writeAttribute( "type", result.getTestMacroName() );

            ReusableStringStream rss;
            if (stats.totals.assertions.total() > 0) {
                rss << "FAILED" << ":\n";
                if (result.hasExpression()) {
                    rss << "  ";
                    rss << result.getExpressionInMacro();
                    rss << '\n';
                }
                if (result.hasExpandedExpression()) {
                    rss << "with expansion:\n";
                    rss << Column(result.getExpandedExpression()).indent(2) << '\n';
                }
            } else {
                rss << '\n';
            }

            if( !result.getMessage().empty() )
                rss << result.getMessage() << '\n';
            for( auto const& msg : stats.infoMessages )
                if( msg.type == ResultWas::Info )
                    rss << msg.message << '\n';

            rss << "at " << result.getSourceInfo();
            xml.writeText( rss.str(), XmlFormatting::Newline );
        }
    }